

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

void Abc_NodeStrashUsingNetwork_rec(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pObj)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkAig_local;
  
  iVar2 = Abc_ObjIsNet(pObj);
  if (iVar2 == 0) {
    if ((pObj->field_6).pTemp == (void *)0x0) {
      for (local_24 = 0; iVar2 = Abc_ObjFaninNum(pObj), local_24 < iVar2; local_24 = local_24 + 1) {
        Abc_ObjFanin(pObj,local_24);
        pAVar3 = Abc_ObjFanin0(pObj);
        pAVar3 = Abc_ObjFanin0Ntk(pAVar3);
        Abc_NodeStrashUsingNetwork_rec(pNtkAig,pAVar3);
      }
      pAVar3 = Abc_NodeStrash(pNtkAig,pObj,0);
      (pObj->field_6).pCopy = pAVar3;
      aVar1 = pObj->field_6;
      pAVar3 = Abc_ObjFanout0(pObj);
      pAVar3->field_6 = aVar1;
    }
    return;
  }
  __assert_fail("!Abc_ObjIsNet(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                ,0x157,"void Abc_NodeStrashUsingNetwork_rec(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_NodeStrashUsingNetwork_rec( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pObj) );
    if ( pObj->pCopy )
        return;
    // call for the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NodeStrashUsingNetwork_rec( pNtkAig, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)) );
    // compute for the node
    pObj->pCopy = Abc_NodeStrash( pNtkAig, pObj, 0 );
    // set for the fanout net
    Abc_ObjFanout0(pObj)->pCopy = pObj->pCopy;
}